

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Warp.cpp
# Opt level: O3

void Handlers::Warp_Accept(Character *character,PacketReader *reader)

{
  pointer ppNVar1;
  Character *this;
  NPC *pNVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  iterator iVar4;
  iterator iVar5;
  uint num;
  pointer psVar6;
  bool bVar7;
  int num_00;
  _List_node_base *p_Var8;
  Map *pMVar9;
  Character **ppCVar10;
  pointer psVar11;
  pointer ppNVar12;
  NPC **ppNVar13;
  vector<Character_*,_std::allocator<Character_*>_> updatecharacters;
  vector<NPC_*,_std::allocator<NPC_*>_> updatenpcs;
  PacketBuilder reply;
  vector<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_> updateitems;
  Character **local_d8;
  iterator iStack_d0;
  Character **local_c8;
  NPC **local_b8;
  iterator iStack_b0;
  NPC **local_a8;
  PacketBuilder local_a0;
  uint local_6c;
  string local_68;
  vector<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_> local_48;
  
  local_6c = (uint)character->warp_anim;
  if (local_6c != 0xff) {
    character->warp_anim = WARP_ANIMATION_INVALID;
    local_c8 = (Character **)0x0;
    local_d8 = (Character **)0x0;
    iStack_d0._M_current = (Character **)0x0;
    local_a8 = (NPC **)0x0;
    local_b8 = (NPC **)0x0;
    iStack_b0._M_current = (NPC **)0x0;
    local_48.
    super__Vector_base<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_48.
    super__Vector_base<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.
    super__Vector_base<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    pMVar9 = character->map;
    p_Var8 = (pMVar9->characters).super__List_base<Character_*,_std::allocator<Character_*>_>.
             _M_impl._M_node.super__List_node_base._M_next;
    if (p_Var8 != (_List_node_base *)&pMVar9->characters) {
      do {
        local_a0._0_8_ = p_Var8[1]._M_next;
        bVar7 = Character::InRange((Character *)local_a0._0_8_,character);
        if (bVar7) {
          if (iStack_d0._M_current == local_c8) {
            std::vector<Character*,std::allocator<Character*>>::_M_realloc_insert<Character*const&>
                      ((vector<Character*,std::allocator<Character*>> *)&local_d8,iStack_d0,
                       (Character **)&local_a0);
          }
          else {
            *iStack_d0._M_current = (Character *)local_a0._0_8_;
            iStack_d0._M_current = iStack_d0._M_current + 1;
          }
        }
        p_Var8 = p_Var8->_M_next;
      } while (p_Var8 != (_List_node_base *)&pMVar9->characters);
      pMVar9 = character->map;
    }
    ppNVar12 = (pMVar9->npcs).super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    ppNVar1 = (pMVar9->npcs).super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (ppNVar12 != ppNVar1) {
      do {
        local_a0._0_8_ = *ppNVar12;
        bVar7 = Character::InRange(character,(NPC *)local_a0._0_8_);
        if ((bVar7) && ((char)*(uint *)(local_a0._0_8_ + 0x10) == '\x01')) {
          if (iStack_b0._M_current == local_a8) {
            std::vector<NPC*,std::allocator<NPC*>>::_M_realloc_insert<NPC*const&>
                      ((vector<NPC*,std::allocator<NPC*>> *)&local_b8,iStack_b0,(NPC **)&local_a0);
          }
          else {
            *iStack_b0._M_current = (NPC *)local_a0._0_8_;
            iStack_b0._M_current = iStack_b0._M_current + 1;
          }
        }
        ppNVar12 = ppNVar12 + 1;
      } while (ppNVar12 != ppNVar1);
      pMVar9 = character->map;
    }
    p_Var8 = (pMVar9->items).
             super__List_base<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>
             ._M_impl._M_node.super__List_node_base._M_next;
    if (p_Var8 != (_List_node_base *)&pMVar9->items) {
      do {
        local_a0._0_8_ = p_Var8[1]._M_next;
        local_a0.data._M_dataplus._M_p = (pointer)p_Var8[1]._M_prev;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0.data._M_dataplus._M_p !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0.data._M_dataplus._M_p)->
            _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_a0.data._M_dataplus._M_p)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0.data._M_dataplus._M_p)->
            _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_a0.data._M_dataplus._M_p)->_M_use_count + 1;
          }
        }
        bVar7 = Character::InRange(character,(Map_Item *)local_a0._0_8_);
        if (bVar7) {
          std::vector<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>::
          push_back(&local_48,(value_type *)&local_a0);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0.data._M_dataplus._M_p !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0.data._M_dataplus._M_p)
          ;
        }
        p_Var8 = p_Var8->_M_next;
      } while (p_Var8 != (_List_node_base *)&pMVar9->items);
    }
    PacketBuilder::PacketBuilder
              (&local_a0,PACKET_WARP,PACKET_AGREE,
               ((long)local_48.
                      super__Vector_base<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_48.
                      super__Vector_base<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 4) * 9 +
               ((long)iStack_d0._M_current - (long)local_d8 >> 3) * 0x3c +
               ((long)iStack_b0._M_current - (long)local_b8 >> 3) * 6 + 7);
    PacketBuilder::AddChar(&local_a0,2);
    num = local_6c;
    PacketBuilder::AddShort(&local_a0,(int)character->mapid);
    PacketBuilder::AddChar(&local_a0,num);
    PacketBuilder::AddChar
              (&local_a0,(int)((ulong)((long)iStack_d0._M_current - (long)local_d8) >> 3));
    PacketBuilder::AddByte(&local_a0,0xff);
    iVar4._M_current = iStack_d0._M_current;
    if (local_d8 != iStack_d0._M_current) {
      ppCVar10 = local_d8;
      do {
        this = *ppCVar10;
        (*(this->super_Command_Source)._vptr_Command_Source[2])(&local_68,this);
        PacketBuilder::AddBreakString(&local_a0,&local_68,0xff);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        }
        num_00 = Character::PlayerID(this);
        PacketBuilder::AddShort(&local_a0,num_00);
        PacketBuilder::AddShort(&local_a0,(int)this->mapid);
        PacketBuilder::AddShort(&local_a0,(uint)this->x);
        PacketBuilder::AddShort(&local_a0,(uint)this->y);
        PacketBuilder::AddChar(&local_a0,(uint)this->direction);
        PacketBuilder::AddChar(&local_a0,6);
        Character::PaddedGuildTag_abi_cxx11_(&local_68,this);
        PacketBuilder::AddString(&local_a0,&local_68);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        }
        PacketBuilder::AddChar(&local_a0,(uint)this->level);
        PacketBuilder::AddChar(&local_a0,(uint)this->gender);
        PacketBuilder::AddChar(&local_a0,(uint)this->hairstyle);
        PacketBuilder::AddChar(&local_a0,(uint)this->haircolor);
        PacketBuilder::AddChar(&local_a0,(uint)this->race);
        PacketBuilder::AddShort(&local_a0,this->maxhp);
        PacketBuilder::AddShort(&local_a0,this->hp);
        PacketBuilder::AddShort(&local_a0,this->maxtp);
        PacketBuilder::AddShort(&local_a0,this->tp);
        Character::AddPaperdollData(this,&local_a0,"B000A0HSW");
        PacketBuilder::AddChar(&local_a0,(uint)this->sitting);
        PacketBuilder::AddChar(&local_a0,this->hidden & 1);
        PacketBuilder::AddByte(&local_a0,0xff);
        ppCVar10 = ppCVar10 + 1;
      } while (ppCVar10 != iVar4._M_current);
    }
    iVar5._M_current = iStack_b0._M_current;
    if (local_b8 != iStack_b0._M_current) {
      ppNVar13 = local_b8;
      do {
        pNVar2 = *ppNVar13;
        PacketBuilder::AddChar(&local_a0,(uint)pNVar2->index);
        PacketBuilder::AddShort(&local_a0,pNVar2->id);
        PacketBuilder::AddChar(&local_a0,(uint)pNVar2->x);
        PacketBuilder::AddChar(&local_a0,(uint)pNVar2->y);
        PacketBuilder::AddChar(&local_a0,(uint)pNVar2->direction);
        ppNVar13 = ppNVar13 + 1;
      } while (ppNVar13 != iVar5._M_current);
    }
    PacketBuilder::AddByte(&local_a0,0xff);
    psVar6 = local_48.
             super__Vector_base<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (local_48.
        super__Vector_base<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        local_48.
        super__Vector_base<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      psVar11 = local_48.
                super__Vector_base<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        peVar3 = (psVar11->super___shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        this_00 = (psVar11->super___shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
                  _M_pi;
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            this_00->_M_use_count = this_00->_M_use_count + 1;
            UNLOCK();
          }
          else {
            this_00->_M_use_count = this_00->_M_use_count + 1;
          }
        }
        PacketBuilder::AddShort(&local_a0,(int)peVar3->uid);
        PacketBuilder::AddShort(&local_a0,(int)peVar3->id);
        PacketBuilder::AddChar(&local_a0,(uint)peVar3->x);
        PacketBuilder::AddChar(&local_a0,(uint)peVar3->y);
        PacketBuilder::AddThree(&local_a0,peVar3->amount);
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        }
        psVar11 = psVar11 + 1;
      } while (psVar11 != psVar6);
    }
    Character::Send(character,&local_a0);
    PacketBuilder::~PacketBuilder(&local_a0);
    std::vector<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>::~vector
              (&local_48);
    if (local_b8 != (NPC **)0x0) {
      operator_delete(local_b8,(long)local_a8 - (long)local_b8);
    }
    if (local_d8 != (Character **)0x0) {
      operator_delete(local_d8,(long)local_c8 - (long)local_d8);
    }
  }
  return;
}

Assistant:

void Warp_Accept(Character *character, PacketReader &reader)
{
	//int map = reader.GetShort();
	(void)reader;

	int anim = character->warp_anim;

	// Removed (character->mapid == map) check as it interferes with fallback maps

	if (anim != WARP_ANIMATION_INVALID)
	{
		character->warp_anim = WARP_ANIMATION_INVALID;
	}
	else
	{
		return;
	}

	std::vector<Character *> updatecharacters;
	std::vector<NPC *> updatenpcs;
	std::vector<std::shared_ptr<Map_Item>> updateitems;

	UTIL_FOREACH(character->map->characters, checkcharacter)
	{
		if (checkcharacter->InRange(character))
		{
			updatecharacters.push_back(checkcharacter);
		}
	}

	UTIL_FOREACH(character->map->npcs, npc)
	{
		if (character->InRange(npc) && npc->alive)
		{
			updatenpcs.push_back(npc);
		}
	}

	UTIL_FOREACH(character->map->items, item)
	{
		if (character->InRange(*item))
		{
			updateitems.push_back(item);
		}
	}

	PacketBuilder reply(PACKET_WARP, PACKET_AGREE,
		7 + updatecharacters.size() * 60 + updatenpcs.size() * 6 + updateitems.size() * 9);

	reply.AddChar(2); // ?
	reply.AddShort(character->mapid);
	reply.AddChar(anim);
	reply.AddChar(updatecharacters.size());
	reply.AddByte(255);
	UTIL_FOREACH(updatecharacters, character)
	{
		reply.AddBreakString(character->SourceName());
		reply.AddShort(character->PlayerID());
		reply.AddShort(character->mapid);
		reply.AddShort(character->x);
		reply.AddShort(character->y);
		reply.AddChar(character->direction);
		reply.AddChar(6); // ?
		reply.AddString(character->PaddedGuildTag());
		reply.AddChar(character->level);
		reply.AddChar(character->gender);
		reply.AddChar(character->hairstyle);
		reply.AddChar(character->haircolor);
		reply.AddChar(character->race);
		reply.AddShort(character->maxhp);
		reply.AddShort(character->hp);
		reply.AddShort(character->maxtp);
		reply.AddShort(character->tp);
		// equipment
		character->AddPaperdollData(reply, "B000A0HSW");

		reply.AddChar(character->sitting);
		reply.AddChar(character->IsHideInvisible());
		reply.AddByte(255);
	}
	UTIL_FOREACH(updatenpcs, npc)
	{
		reply.AddChar(npc->index);
		reply.AddShort(npc->id);
		reply.AddChar(npc->x);
		reply.AddChar(npc->y);
		reply.AddChar(npc->direction);
	}
	reply.AddByte(255);
	UTIL_FOREACH(updateitems, item)
	{
		reply.AddShort(item->uid);
		reply.AddShort(item->id);
		reply.AddChar(item->x);
		reply.AddChar(item->y);
		reply.AddThree(item->amount);
	}
	character->Send(reply);
}